

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_yield(lua_State *L,int nresults)

{
  byte bVar1;
  TValue *t;
  TValue *pTVar2;
  ulong uVar3;
  ulong uVar4;
  TValue *pTVar5;
  TValue TVar6;
  int iVar7;
  
  if (((ulong)L->cframe & 1) == 0) {
    lj_err_msg(L,LJ_ERR_CYIELD);
  }
  uVar4 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar4 + 0x109);
  if ((bVar1 & 0x10) == 0) {
    pTVar2 = L->base;
    pTVar5 = L->top + -(long)nresults;
    if (pTVar2 < pTVar5) {
      if (0 < nresults) {
        iVar7 = nresults + 1;
        do {
          TVar6 = *pTVar5;
          pTVar5 = pTVar5 + 1;
          *pTVar2 = TVar6;
          pTVar2 = pTVar2 + 1;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      L->top = pTVar2;
    }
    L->cframe = (void *)0x0;
    L->status = '\x01';
    return -1;
  }
  uVar3 = (ulong)L->cframe & 0xfffffffffffffffc;
  pTVar5 = L->top;
  *(byte *)(uVar4 + 0x109) = bVar1 & 0xef;
  TVar6.field_2.it = 0;
  TVar6.field_2.field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)*(uint *)(uVar3 + 4);
  *pTVar5 = TVar6;
  pTVar5[1].n = 7.64665400068497e-320;
  *(int *)((long)pTVar5 + 0xc) = *(int *)(uVar3 + 0x1c) + -4;
  pTVar5[2].u32.lo = (uint32_t)L;
  pTVar2 = pTVar5 + 3;
  *(int *)((long)pTVar5 + 0x14) = ((int)pTVar2 - *(int *)&L->base) + 2;
  L->base = pTVar2;
  L->top = pTVar2;
  lj_err_throw(L,1);
}

Assistant:

LUA_API int lua_yield(lua_State *L, int nresults)
{
  void *cf = L->cframe;
  global_State *g = G(L);
  if (cframe_canyield(cf)) {
    cf = cframe_raw(cf);
    if (!hook_active(g)) {  /* Regular yield: move results down if needed. */
      cTValue *f = L->top - nresults;
      if (f > L->base) {
	TValue *t = L->base;
	while (--nresults >= 0) copyTV(L, t++, f++);
	L->top = t;
      }
      L->cframe = NULL;
      L->status = LUA_YIELD;
      return -1;
    } else {  /* Yield from hook: add a pseudo-frame. */
      TValue *top = L->top;
      hook_leave(g);
      (top++)->u64 = cframe_multres(cf);
      setcont(top, lj_cont_hook);
      if (LJ_FR2) top++;
      setframe_pc(top, cframe_pc(cf)-1);
      top++;
      setframe_gc(top, obj2gco(L), LJ_TTHREAD);
      if (LJ_FR2) top++;
      setframe_ftsz(top, ((char *)(top+1)-(char *)L->base)+FRAME_CONT);
      L->top = L->base = top+1;
#if ((defined(__GNUC__) || defined(__clang__)) && (LJ_TARGET_X64 || defined(LUAJIT_UNWIND_EXTERNAL)) && !LJ_NO_UNWIND) || LJ_TARGET_WINDOWS
      lj_err_throw(L, LUA_YIELD);
#else
      L->cframe = NULL;
      L->status = LUA_YIELD;
      lj_vm_unwind_c(cf, LUA_YIELD);
#endif
    }
  }
  lj_err_msg(L, LJ_ERR_CYIELD);
  return 0;  /* unreachable */
}